

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O0

void __thiscall
r_exec::NoArgCmdGuardBuilder::_build
          (NoArgCmdGuardBuilder *this,Code *mdl,uint16_t q0,uint16_t t0,uint16_t t1,
          uint16_t *write_index)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Atom local_64 [4];
  Atom local_60 [6];
  uint16_t local_5a;
  Atom local_58 [6];
  uint16_t extent_index;
  Atom local_48 [4];
  uint16_t local_44;
  uint16_t local_42;
  uint16_t cmd_t1;
  long *plStack_40;
  uint16_t cmd_t0;
  Code *lhs;
  uint16_t t3;
  long *plStack_30;
  uint16_t t2;
  Code *rhs;
  uint16_t *write_index_local;
  uint16_t t1_local;
  uint16_t t0_local;
  Code *pCStack_18;
  uint16_t q0_local;
  Code *mdl_local;
  NoArgCmdGuardBuilder *this_local;
  
  rhs = (Code *)write_index;
  write_index_local._2_2_ = t1;
  write_index_local._4_2_ = t0;
  write_index_local._6_2_ = q0;
  pCStack_18 = mdl;
  mdl_local = (Code *)this;
  iVar1 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plStack_30 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plStack_30 + 0x20))();
  lhs._6_2_ = r_code::Atom::asIndex();
  (**(code **)(*plStack_30 + 0x20))();
  lhs._4_2_ = r_code::Atom::asIndex();
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[9])(pCStack_18,0);
  plStack_40 = (long *)CONCAT44(extraout_var_00,iVar1);
  (**(code **)(*plStack_40 + 0x20))(plStack_40,2);
  local_42 = r_code::Atom::asIndex();
  (**(code **)(*plStack_40 + 0x20))(plStack_40,3);
  local_44 = r_code::Atom::asIndex();
  *(short *)&(rhs->super__Object)._vptr__Object = *(short *)&(rhs->super__Object)._vptr__Object + 1;
  r_code::Atom::IPointer((ushort)local_48);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_48);
  r_code::Atom::~Atom(local_48);
  r_code::Atom::Set((uchar)local_58);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])
                    (pCStack_18,(ulong)*(ushort *)&(rhs->super__Object)._vptr__Object);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_58);
  r_code::Atom::~Atom(local_58);
  local_5a = *(short *)&(rhs->super__Object)._vptr__Object + 2;
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,lhs._6_2_,write_index_local._4_2_,
             Opcodes::Add,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_5a);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,lhs._4_2_,write_index_local._2_2_,
             Opcodes::Add,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_5a);
  *(uint16_t *)&(rhs->super__Object)._vptr__Object = local_5a;
  *(short *)&(rhs->super__Object)._vptr__Object = *(short *)&(rhs->super__Object)._vptr__Object + 1;
  r_code::Atom::IPointer((ushort)local_60);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_60);
  r_code::Atom::~Atom(local_60);
  r_code::Atom::Set((uchar)local_64);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])
                    (pCStack_18,(ulong)*(ushort *)&(rhs->super__Object)._vptr__Object);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_64);
  r_code::Atom::~Atom(local_64);
  local_5a = *(short *)&(rhs->super__Object)._vptr__Object + 4;
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,write_index_local._4_2_,lhs._6_2_,
             Opcodes::Sub,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_5a);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,write_index_local._2_2_,lhs._4_2_,
             Opcodes::Sub,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_5a);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,local_42,lhs._6_2_,Opcodes::Sub,this->offset
             ,(uint16_t *)rhs,&local_5a);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,local_44,local_42,Opcodes::Add,
             this->cmd_duration,(uint16_t *)rhs,&local_5a);
  *(uint16_t *)&(rhs->super__Object)._vptr__Object = local_5a;
  return;
}

Assistant:

void NoArgCmdGuardBuilder::_build(Code *mdl, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t cmd_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t cmd_t1 = lhs->code(FACT_BEFORE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(2);
    uint16_t extent_index = write_index + 2;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(4);
    extent_index = write_index + 4;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, cmd_t0, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, cmd_t1, cmd_t0, Opcodes::Add, cmd_duration, write_index, extent_index);
    write_index = extent_index;
}